

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,ImDrawFlags flags)

{
  ImVec2 *pIVar1;
  ImVec2 *__src;
  uint uVar2;
  ImVec2 *pIVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (flags == -1) {
    uVar4 = 0xf0;
  }
  else if (flags - 1U < 0xf) {
    uVar4 = flags << 4;
  }
  else {
    if ((flags & 0xfU) != 0) {
      __assert_fail("(flags & 0x0F) == 0 && \"Misuse of legacy hardcoded ImDrawCornerFlags values!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0x532,"ImDrawFlags FixRectCornerFlags(ImDrawFlags)");
    }
    uVar4 = flags | 0xf0;
    if ((flags & 0x1f0U) != 0) {
      uVar4 = flags;
    }
  }
  uVar2 = ~uVar4;
  fVar9 = 0.5;
  if ((uVar2 & 0xc0) != 0) {
    fVar9 = 1.0;
  }
  fVar11 = 0.5;
  if ((uVar2 & 0x30) != 0) {
    fVar11 = fVar9;
  }
  fVar9 = 0.5;
  if ((uVar2 & 0xa0) != 0) {
    fVar9 = 1.0;
  }
  fVar8 = 0.5;
  if ((uVar2 & 0x50) != 0) {
    fVar8 = fVar9;
  }
  if ((uVar4 & 0x1f0) != 0x100) {
    fVar9 = (*a).x;
    fVar10 = (*a).y;
    fVar11 = ABS(b->x - fVar9) * fVar11 + -1.0;
    if (fVar11 <= rounding) {
      rounding = fVar11;
    }
    fVar11 = ABS(b->y - fVar10) * fVar8 + -1.0;
    if (fVar11 <= rounding) {
      rounding = fVar11;
    }
    if (0.0 < rounding) {
      fVar11 = 0.0;
      if ((uVar4 & 0x10) != 0) {
        fVar11 = rounding;
      }
      local_4c = 0.0;
      if ((uVar4 & 0x20) != 0) {
        local_4c = rounding;
      }
      fVar8 = 0.0;
      uVar12 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((char)uVar4 < '\0') {
        fVar8 = rounding;
        uVar12 = in_XMM0_Db;
        uStack_40 = in_XMM0_Dc;
        uStack_3c = in_XMM0_Dd;
      }
      local_48 = (ImVec2 *)CONCAT44(uVar12,fVar8);
      local_50 = 0.0;
      if ((uVar4 & 0x40) != 0) {
        local_50 = rounding;
      }
      local_58.x = fVar9 + fVar11;
      local_58.y = fVar10 + fVar11;
      PathArcToFast(this,&local_58,fVar11,6,9);
      local_58.y = a->y + local_4c;
      local_58.x = b->x - local_4c;
      PathArcToFast(this,&local_58,local_4c,9,0xc);
      local_58.x = (*b).x - (float)local_48;
      local_58.y = (*b).y - (float)local_48;
      PathArcToFast(this,&local_58,(float)local_48,0,3);
      local_58.y = b->y - local_50;
      local_58.x = a->x + local_50;
      PathArcToFast(this,&local_58,local_50,3,6);
      return;
    }
  }
  iVar6 = (this->_Path).Size;
  if (iVar6 == (this->_Path).Capacity) {
    if (iVar6 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar6 / 2 + iVar6;
    }
    iVar7 = iVar6 + 1;
    if (iVar6 + 1 < iVar5) {
      iVar7 = iVar5;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
    pIVar1 = (this->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar7;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  pIVar3[iVar6] = *a;
  iVar5 = (this->_Path).Size;
  iVar6 = iVar5 + 1;
  (this->_Path).Size = iVar6;
  fVar9 = b->x;
  fVar11 = a->y;
  local_48 = a;
  if (iVar6 == (this->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar1 = (this->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  pIVar1 = local_48;
  pIVar3[iVar6].x = fVar9;
  pIVar3[iVar6].y = fVar11;
  iVar5 = (this->_Path).Size;
  iVar6 = iVar5 + 1;
  (this->_Path).Size = iVar6;
  if (iVar6 == (this->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    __src = (this->_Path).Data;
    if (__src != (ImVec2 *)0x0) {
      memcpy(pIVar3,__src,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  pIVar3[iVar6] = *b;
  iVar5 = (this->_Path).Size;
  iVar6 = iVar5 + 1;
  (this->_Path).Size = iVar6;
  fVar9 = pIVar1->x;
  fVar11 = b->y;
  if (iVar6 == (this->_Path).Capacity) {
    iVar5 = iVar5 + 2;
    if (iVar6 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar6 / 2 + iVar6;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    pIVar1 = (this->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar3,pIVar1,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = pIVar3;
    (this->_Path).Capacity = iVar5;
    iVar6 = (this->_Path).Size;
  }
  else {
    pIVar3 = (this->_Path).Data;
  }
  pIVar3[iVar6].x = fVar9;
  pIVar3[iVar6].y = fVar11;
  (this->_Path).Size = (this->_Path).Size + 1;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, ImDrawFlags flags)
{
    flags = FixRectCornerFlags(flags);
    rounding = ImMin(rounding, ImFabs(b.x - a.x) * ( ((flags & ImDrawFlags_RoundCornersTop)  == ImDrawFlags_RoundCornersTop)  || ((flags & ImDrawFlags_RoundCornersBottom) == ImDrawFlags_RoundCornersBottom) ? 0.5f : 1.0f ) - 1.0f);
    rounding = ImMin(rounding, ImFabs(b.y - a.y) * ( ((flags & ImDrawFlags_RoundCornersLeft) == ImDrawFlags_RoundCornersLeft) || ((flags & ImDrawFlags_RoundCornersRight)  == ImDrawFlags_RoundCornersRight)  ? 0.5f : 1.0f ) - 1.0f);

    if (rounding <= 0.0f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x, a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x, b.y));
    }
    else
    {
        const float rounding_tl = (flags & ImDrawFlags_RoundCornersTopLeft)     ? rounding : 0.0f;
        const float rounding_tr = (flags & ImDrawFlags_RoundCornersTopRight)    ? rounding : 0.0f;
        const float rounding_br = (flags & ImDrawFlags_RoundCornersBottomRight) ? rounding : 0.0f;
        const float rounding_bl = (flags & ImDrawFlags_RoundCornersBottomLeft)  ? rounding : 0.0f;
        PathArcToFast(ImVec2(a.x + rounding_tl, a.y + rounding_tl), rounding_tl, 6, 9);
        PathArcToFast(ImVec2(b.x - rounding_tr, a.y + rounding_tr), rounding_tr, 9, 12);
        PathArcToFast(ImVec2(b.x - rounding_br, b.y - rounding_br), rounding_br, 0, 3);
        PathArcToFast(ImVec2(a.x + rounding_bl, b.y - rounding_bl), rounding_bl, 3, 6);
    }
}